

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::createSpvConstant
          (TGlslangToSpvTraverser *this,TIntermTyped *node)

{
  Builder *this_00;
  ulong uVar1;
  _func_int **pp_Var2;
  long *plVar3;
  SpvBuildLogger *this_01;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  Id IVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long *plVar9;
  TType *pTVar10;
  long lVar11;
  TConstUnionArray *consts;
  int dim;
  Id local_5c;
  int nextConst;
  uint uStack_54;
  pointer puStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined4 extraout_var_11;
  
  iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x22])(node);
  uVar1 = *(ulong *)(CONCAT44(extraout_var,iVar6) + 8);
  if ((uVar1 & 0x100000000) == 0 && (uVar1 & 0x10000007f) != 2) {
    __assert_fail("node.getQualifier().isConstant()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x288e,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstant(const glslang::TIntermTyped &)"
                 );
  }
  iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x22])(node);
  pp_Var2 = (node->super_TIntermNode)._vptr_TIntermNode;
  if ((*(ulong *)(CONCAT44(extraout_var_00,iVar6) + 8) & 0x100000000) == 0) {
    iVar6 = (*pp_Var2[0x11])(node);
    if (CONCAT44(extraout_var_01,iVar6) == 0) {
      iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node);
      if (CONCAT44(extraout_var_02,iVar6) == 0) {
        __assert_fail("node.getAsConstantUnion() != nullptr || node.getAsSymbolNode() != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x2893,
                      "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstant(const glslang::TIntermTyped &)"
                     );
      }
    }
    _nextConst = (pointer)((ulong)uStack_54 << 0x20);
    iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    iVar7 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])(node);
    lVar11 = 0x88;
    if (CONCAT44(extraout_var_04,iVar7) == 0) {
      lVar11 = 0xc0;
    }
    lVar11 = (**(code **)((long)(node->super_TIntermNode)._vptr_TIntermNode + lVar11))(node);
    consts = (TConstUnionArray *)(lVar11 + 0xb8);
    if (CONCAT44(extraout_var_04,iVar7) == 0) {
      consts = (TConstUnionArray *)(lVar11 + 0x120);
    }
    IVar8 = createSpvConstantFromConstUnionArray
                      (this,(TType *)CONCAT44(extraout_var_03,iVar6),consts,&nextConst,false);
  }
  else {
    iVar6 = (*pp_Var2[0x1e])(node);
    bVar4 = glslang::TType::contains8BitInt((TType *)CONCAT44(extraout_var_05,iVar6));
    if (bVar4) {
      spv::Builder::addCapability(&this->builder,CapabilityInt8);
    }
    iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 400))
                      ((long *)CONCAT44(extraout_var_06,iVar6),3);
    if (cVar5 != '\0') {
      spv::Builder::addCapability(&this->builder,CapabilityFloat16);
    }
    iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    bVar4 = glslang::TType::contains16BitInt((TType *)CONCAT44(extraout_var_07,iVar6));
    if (bVar4) {
      spv::Builder::addCapability(&this->builder,CapabilityInt16);
    }
    iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    bVar4 = glslang::TType::contains64BitInt((TType *)CONCAT44(extraout_var_08,iVar6));
    if (bVar4) {
      spv::Builder::addCapability(&this->builder,CapabilityInt64);
    }
    iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar6) + 400))
                      ((long *)CONCAT44(extraout_var_09,iVar6),2);
    if (cVar5 != '\0') {
      spv::Builder::addCapability(&this->builder,CapabilityFloat64);
    }
    iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    lVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 0x58))
                       ((long *)CONCAT44(extraout_var_10,iVar6));
    if ((*(uint *)(lVar11 + 8) & 0xff80) == 0x100) {
      _nextConst = (pointer)0x0;
      puStack_50 = (pointer)0x0;
      local_48._M_allocated_capacity = 0;
      this_00 = &this->builder;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        iVar6 = this->glslangIntermediate->localSizeSpecId[lVar11];
        local_5c = spv::Builder::makeUintConstant
                             (this_00,this->glslangIntermediate->localSize[lVar11],iVar6 != -1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nextConst,&local_5c);
        if (iVar6 != -1) {
          spv::Builder::addDecoration
                    (this_00,puStack_50[-1],DecorationSpecId,
                     this->glslangIntermediate->localSizeSpecId[lVar11]);
        }
      }
      IVar8 = spv::Builder::makeUintType(this_00,0x20);
      IVar8 = spv::Builder::makeVectorType(this_00,IVar8,3);
      IVar8 = spv::Builder::makeCompositeConstant
                        (this_00,IVar8,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nextConst,true);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&nextConst);
    }
    else {
      iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node);
      plVar9 = (long *)CONCAT44(extraout_var_11,iVar6);
      if (plVar9 == (long *)0x0) {
        this_01 = this->logger;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nextConst,"Neither a front-end constant nor a spec constant.",
                   (allocator<char> *)&local_5c);
        spv::SpvBuildLogger::missingFunctionality(this_01,(string *)&nextConst);
        std::__cxx11::string::_M_dispose();
        IVar8 = 0;
      }
      else {
        plVar3 = (long *)plVar9[0x26];
        if (plVar3 == (long *)0x0) {
          _nextConst = _nextConst & 0xffffffff00000000;
          pTVar10 = (TType *)(**(code **)(*plVar9 + 0xf0))(plVar9);
          IVar8 = createSpvConstantFromConstUnionArray
                            (this,pTVar10,(TConstUnionArray *)(plVar9 + 0x24),&nextConst,true);
        }
        else {
          (**(code **)(*plVar3 + 0x10))(plVar3,this);
          pTVar10 = (TType *)(**(code **)(*plVar3 + 0xf0))(plVar3);
          IVar8 = accessChainLoad(this,pTVar10);
        }
        lVar11 = (**(code **)(*plVar9 + 400))(plVar9);
        spv::Builder::addName(&this->builder,IVar8,*(char **)(lVar11 + 8));
      }
    }
  }
  return IVar8;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createSpvConstant(const glslang::TIntermTyped& node)
{
    assert(node.getQualifier().isConstant());

    // Handle front-end constants first (non-specialization constants).
    if (! node.getQualifier().specConstant) {
        // hand off to the non-spec-constant path
        assert(node.getAsConstantUnion() != nullptr || node.getAsSymbolNode() != nullptr);
        int nextConst = 0;
        return createSpvConstantFromConstUnionArray(node.getType(), node.getAsConstantUnion() ?
            node.getAsConstantUnion()->getConstArray() : node.getAsSymbolNode()->getConstArray(),
            nextConst, false);
    }

    // We now know we have a specialization constant to build

    // Extra capabilities may be needed.
    if (node.getType().contains8BitInt())
        builder.addCapability(spv::CapabilityInt8);
    if (node.getType().contains16BitFloat())
        builder.addCapability(spv::CapabilityFloat16);
    if (node.getType().contains16BitInt())
        builder.addCapability(spv::CapabilityInt16);
    if (node.getType().contains64BitInt())
        builder.addCapability(spv::CapabilityInt64);
    if (node.getType().containsDouble())
        builder.addCapability(spv::CapabilityFloat64);

    // gl_WorkGroupSize is a special case until the front-end handles hierarchical specialization constants,
    // even then, it's specialization ids are handled by special case syntax in GLSL: layout(local_size_x = ...
    if (node.getType().getQualifier().builtIn == glslang::EbvWorkGroupSize) {
        std::vector<spv::Id> dimConstId;
        for (int dim = 0; dim < 3; ++dim) {
            bool specConst = (glslangIntermediate->getLocalSizeSpecId(dim) != glslang::TQualifier::layoutNotSet);
            dimConstId.push_back(builder.makeUintConstant(glslangIntermediate->getLocalSize(dim), specConst));
            if (specConst) {
                builder.addDecoration(dimConstId.back(), spv::DecorationSpecId,
                                      glslangIntermediate->getLocalSizeSpecId(dim));
            }
        }
        return builder.makeCompositeConstant(builder.makeVectorType(builder.makeUintType(32), 3), dimConstId, true);
    }

    // An AST node labelled as specialization constant should be a symbol node.
    // Its initializer should either be a sub tree with constant nodes, or a constant union array.
    if (auto* sn = node.getAsSymbolNode()) {
        spv::Id result;
        if (auto* sub_tree = sn->getConstSubtree()) {
            // Traverse the constant constructor sub tree like generating normal run-time instructions.
            // During the AST traversal, if the node is marked as 'specConstant', SpecConstantOpModeGuard
            // will set the builder into spec constant op instruction generating mode.
            sub_tree->traverse(this);
            result = accessChainLoad(sub_tree->getType());
        } else if (auto* const_union_array = &sn->getConstArray()) {
            int nextConst = 0;
            result = createSpvConstantFromConstUnionArray(sn->getType(), *const_union_array, nextConst, true);
        } else {
            logger->missingFunctionality("Invalid initializer for spec onstant.");
            return spv::NoResult;
        }
        builder.addName(result, sn->getName().c_str());
        return result;
    }

    // Neither a front-end constant node, nor a specialization constant node with constant union array or
    // constant sub tree as initializer.
    logger->missingFunctionality("Neither a front-end constant nor a spec constant.");
    return spv::NoResult;
}